

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void buffer_remove(BUFFER *buf,size_t off,size_t n)

{
  size_t alloc;
  BUFFER *in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t new_alloc;
  
  if ((ulong)((long)&in_RDX->data + in_RSI) < (ulong)in_RDI[1]) {
    memmove((void *)(*in_RDI + in_RSI),(void *)((long)&in_RDX->data + *in_RDI + in_RSI),
            (in_RDI[1] - in_RSI) - (long)in_RDX);
    in_RDI[1] = in_RDI[1] - (long)in_RDX;
  }
  else {
    in_RDI[1] = in_RSI;
  }
  if (in_RDI[1] == 0) {
    free((void *)*in_RDI);
    *in_RDI = 0;
    in_RDI[2] = 0;
  }
  else if (((ulong)in_RDI[1] < (ulong)in_RDI[2] >> 2) &&
          (alloc = buffer_good_alloc_size(in_RDI[1] << 1), alloc < (ulong)in_RDI[2] >> 1)) {
    buffer_realloc(in_RDX,alloc);
  }
  return;
}

Assistant:

void
buffer_remove(BUFFER* buf, size_t off, size_t n)
{
    if(off + n < buf->size) {
        memmove((uint8_t*)buf->data + off, (uint8_t*)buf->data + off + n, buf->size - off - n);
        buf->size -= n;
    } else {
        buf->size = off;
    }

    if(buf->size == 0) {
        free(buf->data);
        buf->data = NULL;
        buf->alloc = 0;
    } else if(buf->size < buf->alloc / 4) {
        size_t new_alloc = buffer_good_alloc_size(buf->size * 2);
        if(new_alloc < buf->alloc / 2) {
            /* No error checking here: If the realloc fails, we still have valid
             * albeit bloated buffer. */
            buffer_realloc(buf, new_alloc);
        }
    }
}